

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyFrame.h
# Opt level: O2

void __thiscall chrono::ChBodyFrame::ChBodyFrame(ChBodyFrame *this)

{
  ChVector<double> local_48;
  ChQuaternion<double> local_28;
  
  local_48.m_data[2] = 0.0;
  local_28.m_data[0] = 1.0;
  local_28.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_28.m_data[1] = 0.0;
  local_28.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->super_ChFrameMoving<double>,&local_48,&local_28);
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChFrame_0114fae0;
  return;
}

Assistant:

virtual ~ChBodyFrame() {}